

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.cpp
# Opt level: O2

void banksia::Jsonable::merge(Value *main,Value *from,JsonMerge merge)

{
  bool bVar1;
  Value *other;
  Value *this;
  Members *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  pointer key;
  Members names;
  Members local_48;
  
  Json::Value::getMemberNames_abi_cxx11_(&local_48,from);
  key = local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (key == local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      return;
    }
    if (merge == overwrite) {
LAB_00169ed9:
      other = Json::Value::operator[](from,key);
      this = Json::Value::operator[](main,key);
      Json::Value::operator=(this,other);
    }
    else {
      bVar1 = Json::Value::isMember(main,key);
      if (!bVar1) goto LAB_00169ed9;
    }
    key = key + 1;
  } while( true );
}

Assistant:

void Jsonable::merge(Json::Value& main, const Json::Value& from, JsonMerge merge)
{
    auto names = from.getMemberNames();
    for(auto && name : names) {
        if (merge == JsonMerge::overwrite || !main.isMember(name)) {
            main[name] = from[name];
        }
    }
}